

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void * WindowSettingsHandler_ReadOpen
                 (ImGuiContext *param_1,ImGuiSettingsHandler *param_2,char *name)

{
  char *in_RDX;
  ImGuiWindowSettings *settings;
  undefined8 local_20;
  
  ImHashStr(in_RDX,0,0);
  local_20 = ImGui::FindWindowSettings((ImGuiID)((ulong)in_RDX >> 0x20));
  if (local_20 == (ImGuiWindowSettings *)0x0) {
    local_20 = ImGui::CreateNewWindowSettings(&param_1->Initialized);
  }
  return local_20;
}

Assistant:

static void* WindowSettingsHandler_ReadOpen(ImGuiContext*, ImGuiSettingsHandler*, const char* name)
{
    ImGuiWindowSettings* settings = ImGui::FindWindowSettings(ImHashStr(name));
    if (!settings)
        settings = ImGui::CreateNewWindowSettings(name);
    return (void*)settings;
}